

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

long duckdb::DecimalScaleDownOperator::Operation<long,long>
               (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  long lVar1;
  DecimalScaleInput<long,_long> *data;
  
  lVar1 = input / (*(long *)((long)dataptr + 0x28) / 2);
  lVar1 = Cast::Operation<long,long>((long)(lVar1 + (lVar1 >> 0x3f | 1U)) / 2);
  return lVar1;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		//	We need to round here, not truncate.
		auto data = (DecimalScaleInput<INPUT_TYPE> *)dataptr;
		//	Scale first so we don't overflow when rounding.
		const auto scaling = data->factor / 2;
		input /= scaling;
		if (input < 0) {
			input -= 1;
		} else {
			input += 1;
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input / 2);
	}